

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_impl.hpp
# Opt level: O0

Bound_slot_container * __thiscall
sig::
Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
::bind_args<int&>(Bound_slot_container *__return_storage_ptr__,
                 Signal_impl<void(int),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(int)>,std::mutex>
                 *this,int *args)

{
  bool bVar1;
  reference ppVar2;
  pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>
  *group;
  const_iterator __end0;
  const_iterator __begin0;
  Group_container *__range3;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> lock;
  anon_class_16_2_93a8cea0 bind_slots;
  int *args_local;
  Signal_impl<void_(int),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(int)>,_std::mutex>
  *this_local;
  Bound_slot_container *bound_slots;
  
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (__return_storage_ptr__);
  lock._M_device = (mutex_type *)__return_storage_ptr__;
  std::lock_guard<std::mutex>::lock_guard(&local_40,(mutex_type *)(this + 0xe0));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&lock,
             (deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
              *)(this + 8));
  __end0 = std::
           map<int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>_>_>
           ::begin((map<int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>_>_>
                    *)(this + 0x58));
  group = (pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>
           *)std::
             map<int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>_>_>
             ::end((map<int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>_>_>
                    *)(this + 0x58));
  while (bVar1 = std::operator!=(&__end0,(_Self *)&group), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>_>
             ::operator*(&__end0);
    const::{lambda(auto:1&)#1}::operator()((_lambda_auto_1___1_ *)&lock,&ppVar2->second);
    std::
    _Rb_tree_const_iterator<std::pair<const_int,_std::deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>_>_>
    ::operator++(&__end0);
  }
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)&lock,
             (deque<std::shared_ptr<sig::Connection_impl<void_(int)>_>,_std::allocator<std::shared_ptr<sig::Connection_impl<void_(int)>_>_>_>
              *)(this + 0x88));
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Bound_slot_container bind_args(Params&&... args) const {
        Bound_slot_container bound_slots;
        // Helper Function
        auto bind_slots = [&bound_slots, &args...](auto& conn_container) {
            for (auto& connection : conn_container) {
                if (connection->connected() && !connection->blocked() &&
                    !connection->get_slot().expired()) {
                    auto& slot = connection->get_slot();
                    bound_slots.push_back([slot, &args...] {
                        return slot(std::forward<Params>(args)...);
                    });
                }
            }
        };
        std::lock_guard<Mutex> lock{mtx_};
        // Bind arguments to all three types of connected Slots.
        bind_slots(connections_.front);
        for (auto& group : connections_.grouped) {
            bind_slots(group.second);
        }
        bind_slots(connections_.back);
        return bound_slots;
    }